

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue::~IfcPropertyEnumeratedValue
          (IfcPropertyEnumeratedValue *this)

{
  *(undefined ***)this = &PTR__IfcPropertyEnumeratedValue_007f09c0;
  *(undefined ***)&this->field_0xa0 = &PTR__IfcPropertyEnumeratedValue_007f0a38;
  *(undefined ***)&this->field_0x58 = &PTR__IfcPropertyEnumeratedValue_007f09e8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue,_2UL>).
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcPropertyEnumeratedValue_007f0a10;
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::~vector((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue,_2UL>)
                .field_0x10);
  *(undefined8 *)this = 0x7f0b50;
  *(undefined8 *)&this->field_0xa0 = 0x7f0b78;
  if (*(undefined1 **)&this->field_0x30 != &this->field_0x40) {
    operator_delete(*(undefined1 **)&this->field_0x30,*(long *)&this->field_0x40 + 1);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
    return;
  }
  return;
}

Assistant:

IfcPropertyEnumeratedValue() : Object("IfcPropertyEnumeratedValue") {}